

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::snedecor_f_dist<float>::icdf(snedecor_f_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  float in_XMM0_Da;
  float fVar2;
  snedecor_f_dist<float> *unaff_retaddr;
  result_type_conflict1 in_stack_fffffffffffffffc;
  
  if ((in_XMM0_Da <= 0.0) || (1.0 <= in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    fVar2 = std::numeric_limits<float>::quiet_NaN();
  }
  else if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      fVar2 = icdf_(unaff_retaddr,in_stack_fffffffffffffffc);
    }
    else {
      fVar2 = std::numeric_limits<float>::infinity();
    }
  }
  else {
    fVar2 = 0.0;
  }
  return fVar2;
}

Assistant:

icdf(result_type x) const {
      if (x <= 0 or x >= 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 0)
        return 0;
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      return icdf_(x);
    }